

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O0

_Bool portfwdmgr_unlisten(PortFwdManager *mgr,char *host,int port)

{
  PortFwdRecord *pfr_00;
  PortFwdRecord *pfr;
  PortFwdRecord pfr_key;
  int port_local;
  char *host_local;
  PortFwdManager *mgr_local;
  
  pfr._4_4_ = 0x4c;
  pfr_key.sserv = (char *)0x0;
  pfr_key.daddr = (char *)0x0;
  pfr_key.addressfamily = 0;
  pfr_key._60_4_ = 0;
  pfr_key.dserv = (char *)0x0;
  pfr_key.remote._0_4_ = 0;
  pfr_key.status = port;
  pfr_key.type = port;
  pfr_key._8_8_ = host;
  pfr_key.saddr = host;
  pfr_key.local._4_4_ = port;
  pfr_00 = (PortFwdRecord *)del234(mgr->forwardings,&pfr);
  if (pfr_00 != (PortFwdRecord *)0x0) {
    logeventf(mgr->cl->logctx,"Closing listening port %s:%d",host,(ulong)pfr_key.local._4_4_);
    pfr_free(pfr_00);
  }
  return pfr_00 != (PortFwdRecord *)0x0;
}

Assistant:

bool portfwdmgr_unlisten(PortFwdManager *mgr, const char *host, int port)
{
    PortFwdRecord pfr_key;

    pfr_key.type = 'L';
    /* Safe to cast the const away here, because it will only be used
     * by pfr_cmp, which won't write to the string */
    pfr_key.saddr = pfr_key.daddr = (char *)host;
    pfr_key.sserv = pfr_key.dserv = NULL;
    pfr_key.sport = pfr_key.dport = port;
    pfr_key.local = NULL;
    pfr_key.remote = NULL;
    pfr_key.addressfamily = ADDRTYPE_UNSPEC;

    PortFwdRecord *pfr = del234(mgr->forwardings, &pfr_key);

    if (!pfr)
        return false;

    logeventf(mgr->cl->logctx, "Closing listening port %s:%d", host, port);

    pfr_free(pfr);
    return true;
}